

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.hpp
# Opt level: O2

StorageBufferBindInfo * __thiscall
Diligent::ShaderVariableManagerGL::
GetResource<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
          (ShaderVariableManagerGL *this,Uint32 ResIndex)

{
  uint uVar1;
  ulong uVar2;
  Uint32 ResIndex_local;
  int local_34;
  string msg;
  
  uVar2 = (ulong)this->m_StorageBufferOffset;
  uVar1 = (uint)((this->m_VariableEndOffset - uVar2) / 0x18);
  if (uVar1 <= ResIndex) {
    local_34 = uVar1 - 1;
    ResIndex_local = ResIndex;
    FormatString<char[17],unsigned_int,char[30],unsigned_int,char[2]>
              (&msg,(Diligent *)"Resource index (",(char (*) [17])&ResIndex_local,
               (uint *)") exceeds max allowed value (",(char (*) [30])&local_34,(uint *)0x2caa26,
               (char (*) [2])CONCAT44(local_34,ResIndex));
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderVariableManagerGL.hpp"
               ,0xf9);
    std::__cxx11::string::~string((string *)&msg);
    uVar2 = (ulong)this->m_StorageBufferOffset;
    ResIndex = ResIndex_local;
  }
  return (StorageBufferBindInfo *)
         ((long)(this->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                m_pVariables + (ulong)ResIndex * 0x18 + uVar2);
}

Assistant:

ResourceType& GetResource(Uint32 ResIndex) const
    {
        VERIFY(ResIndex < GetNumResources<ResourceType>(), "Resource index (", ResIndex, ") exceeds max allowed value (", GetNumResources<ResourceType>() - 1, ")");
        auto Offset = GetResourceOffset<ResourceType>();
        return reinterpret_cast<ResourceType*>(reinterpret_cast<Uint8*>(m_pVariables) + Offset)[ResIndex];
    }